

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_kotlin.cpp
# Opt level: O1

string * __thiscall
flatbuffers::kotlin::KotlinGenerator::GenFBBDefaultValue_abi_cxx11_
          (string *__return_storage_ptr__,KotlinGenerator *this,FieldDef *field)

{
  BaseType BVar1;
  long lVar2;
  char *pcVar3;
  char *pcVar4;
  
  BVar1 = (field->value).type.base_type;
  if ((BVar1 - BASE_TYPE_UTYPE < 0xc) && (field->presence == kOptional)) {
    if (BVar1 - BASE_TYPE_FLOAT < 2) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar4 = "0.0";
      pcVar3 = "";
    }
    else if (BVar1 == BASE_TYPE_BOOL) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar4 = "false";
      pcVar3 = "";
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar4 = "0";
      pcVar3 = "";
    }
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar4,pcVar3);
  }
  else {
    GenDefaultValue_abi_cxx11_(__return_storage_ptr__,this,field,true);
    if ((field->value).type.base_type == BASE_TYPE_FLOAT) {
      lVar2 = std::__cxx11::string::find((char *)__return_storage_ptr__,0x370757,0);
      if (lVar2 != -1) {
        std::__cxx11::string::replace((ulong)__return_storage_ptr__,0,(char *)0x5,0x370761);
      }
    }
    if ((__return_storage_ptr__->_M_dataplus)._M_p[__return_storage_ptr__->_M_string_length - 1] ==
        'f') {
      std::__cxx11::string::pop_back();
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string GenFBBDefaultValue(const FieldDef &field) const {
    if (field.IsScalarOptional()) {
      // although default value is null, java API forces us to present a real
      // default value for scalars, while adding a field to the buffer. This is
      // not a problem because the default can be representing just by not
      // calling builder.addMyField()
      switch (field.value.type.base_type) {
        case BASE_TYPE_DOUBLE:
        case BASE_TYPE_FLOAT: return "0.0";
        case BASE_TYPE_BOOL: return "false";
        default: return "0";
      }
    }
    auto out = GenDefaultValue(field, true);
    // All FlatBufferBuilder default floating point values are doubles
    if (field.value.type.base_type == BASE_TYPE_FLOAT) {
      if (out.find("Float") != std::string::npos) {
        out.replace(0, 5, "Double");
      }
    }
    // Guarantee all values are doubles
    if (out.back() == 'f') out.pop_back();
    return out;
  }